

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cnn.c
# Opt level: O3

int convolve_layer(void *arg1,void *arg2)

{
  av1_cnn_convolve(*arg1,*(int *)((long)arg1 + 8),*(int *)((long)arg1 + 0xc),
                   *(int *)((long)arg1 + 0x10),*(CNN_LAYER_CONFIG **)((long)arg1 + 0x18),
                   *(float ***)((long)arg1 + 0x20),*(int *)((long)arg1 + 0x28),
                   *(int *)((long)arg1 + 0x2c),*(int *)((long)arg1 + 0x30));
  return 1;
}

Assistant:

static int convolve_layer(void *arg1, void *arg2) {
  const CONVOLVE_OPS *convolve_ops = arg1;
  (void)arg2;
  av1_cnn_convolve(
      convolve_ops->input, convolve_ops->in_width, convolve_ops->in_height,
      convolve_ops->in_stride, convolve_ops->layer_config, convolve_ops->output,
      convolve_ops->out_stride, convolve_ops->start_idx, convolve_ops->th_step);
  return 1;
}